

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O2

void __thiscall Fl_Browser_::deleting(Fl_Browser_ *this,void *item)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = displayed(this,item);
  if (iVar1 == 0) {
    this->real_position_ = 0;
    this->offset_ = 0;
    this->top_ = (void *)0x0;
  }
  else {
    redraw_lines(this);
    if (this->top_ == item) {
      this->real_position_ = this->real_position_ - this->offset_;
      this->offset_ = 0;
      iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,item);
      this->top_ = (void *)CONCAT44(extraout_var,iVar1);
      if ((void *)CONCAT44(extraout_var,iVar1) == (void *)0x0) {
        iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,item);
        this->top_ = (void *)CONCAT44(extraout_var_00,iVar1);
      }
    }
  }
  if (this->selection_ == item) {
    this->selection_ = (void *)0x0;
  }
  if (this->max_width_item == item) {
    this->max_width_item = (void *)0x0;
    this->max_width = 0;
  }
  return;
}

Assistant:

void Fl_Browser_::deleting(void* item) {
  if (displayed(item)) {
    redraw_lines();
    if (item == top_) {
      real_position_ -= offset_;
      offset_ = 0;
      top_ = item_next(item);
      if (!top_) top_ = item_prev(item);
    }
  } else {
    // we don't know where this item is, recalculate top...
    real_position_ = 0;
    offset_ = 0;
    top_ = 0;
  }
  if (item == selection_) selection_ = 0;
  if (item == max_width_item) {max_width_item = 0; max_width = 0;}
}